

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O0

void ZopfliLZ77GetHistogram
               (ZopfliLZ77Store *lz77,size_t lstart,size_t lend,size_t *ll_counts,size_t *d_counts)

{
  size_t *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  ZopfliLZ77Store *in_RDI;
  size_t *in_R8;
  size_t d_counts2 [32];
  size_t ll_counts2 [288];
  size_t i;
  size_t asStack_a38 [32];
  size_t local_938 [289];
  ulong local_30;
  size_t *local_28;
  size_t *local_20;
  ulong local_18;
  ulong local_10;
  ZopfliLZ77Store *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_RDX < in_RSI + 0x360) {
    local_18 = in_RDX;
    memset(in_RCX,0,0x900);
    memset(local_28,0,0x100);
    for (local_30 = local_10; local_30 < local_18; local_30 = local_30 + 1) {
      local_20[local_8->ll_symbol[local_30]] = local_20[local_8->ll_symbol[local_30]] + 1;
      if (local_8->dists[local_30] != 0) {
        local_28[local_8->d_symbol[local_30]] = local_28[local_8->d_symbol[local_30]] + 1;
      }
    }
  }
  else {
    ZopfliLZ77GetHistogramAt(in_RDI,in_RDX - 1,in_RCX,in_R8);
    if (local_10 != 0) {
      ZopfliLZ77GetHistogramAt(local_8,local_10 - 1,local_938,asStack_a38);
      for (local_30 = 0; local_30 < 0x120; local_30 = local_30 + 1) {
        local_20[local_30] = local_20[local_30] - local_938[local_30];
      }
      for (local_30 = 0; local_30 < 0x20; local_30 = local_30 + 1) {
        local_28[local_30] = local_28[local_30] - asStack_a38[local_30];
      }
    }
  }
  return;
}

Assistant:

void ZopfliLZ77GetHistogram(const ZopfliLZ77Store* lz77,
                           size_t lstart, size_t lend,
                           size_t* ll_counts, size_t* d_counts) {
  size_t i;
  if (lstart + ZOPFLI_NUM_LL * 3 > lend) {
    memset(ll_counts, 0, sizeof(*ll_counts) * ZOPFLI_NUM_LL);
    memset(d_counts, 0, sizeof(*d_counts) * ZOPFLI_NUM_D);
    for (i = lstart; i < lend; i++) {
      ll_counts[lz77->ll_symbol[i]]++;
      if (lz77->dists[i] != 0) d_counts[lz77->d_symbol[i]]++;
    }
  } else {
    /* Subtract the cumulative histograms at the end and the start to get the
    histogram for this range. */
    ZopfliLZ77GetHistogramAt(lz77, lend - 1, ll_counts, d_counts);
    if (lstart > 0) {
      size_t ll_counts2[ZOPFLI_NUM_LL];
      size_t d_counts2[ZOPFLI_NUM_D];
      ZopfliLZ77GetHistogramAt(lz77, lstart - 1, ll_counts2, d_counts2);

      for (i = 0; i < ZOPFLI_NUM_LL; i++) {
        ll_counts[i] -= ll_counts2[i];
      }
      for (i = 0; i < ZOPFLI_NUM_D; i++) {
        d_counts[i] -= d_counts2[i];
      }
    }
  }
}